

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O2

IOConversionPtr
create_conversion(FFSTypeHandle_conflict src_ioformat,FMFieldList target_field_list,
                 int target_struct_size,int pointer_size,int byte_reversal,
                 FMfloat_format target_fp_format,IOconversion_type initial_conversion,
                 int target_column_major,int string_offset_size,int converted_strings,
                 FMStructDescList target_list)

{
  FMFieldList p_Var1;
  FMFormat_conflict p_Var2;
  FMVarInfoList p_Var3;
  FFSTypeHandle_conflict p_Var4;
  IOConversionPtr_conflict p_Var5;
  IOconvFieldStruct *pIVar6;
  long *plVar7;
  uint uVar8;
  int iVar9;
  FMdata_type FVar10;
  FMdata_type FVar11;
  int iVar12;
  IOConversionPtr conv;
  char *pcVar13;
  ulong uVar14;
  size_t sVar15;
  char *pcVar16;
  void *pvVar17;
  char *pcVar18;
  char *pcVar19;
  IOConversionPtr p_Var20;
  conv_routine p_Var21;
  ulong uVar22;
  long *plVar23;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar24;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  IOConversionPtr *pp_Var25;
  FMFieldList p_Var26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  IOconversion_type IVar30;
  ulong uVar31;
  FMVarInfoStruct *pFVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  double dVar36;
  undefined4 in_stack_0000001c;
  FMStructDescList in_stack_ffffffffffffff08;
  FMfloat_format local_d4;
  void *default_val;
  long in_elements;
  int local_b0;
  int local_ac;
  ulong local_a8;
  IOconvFieldStruct *local_a0;
  ulong local_98;
  ulong local_90;
  FMFieldList local_88;
  int local_80;
  FMfloat_format local_7c;
  IOConversionPtr *local_78;
  FFSTypeHandle_conflict local_70;
  long target_elements;
  size_t local_60;
  FMFieldList local_58;
  FMFieldList local_50;
  FMFieldList local_48;
  ulong local_40;
  size_t local_38;
  
  local_60 = (size_t)target_column_major;
  local_b0 = byte_reversal;
  local_80 = pointer_size;
  uVar8 = count_FMfield(target_field_list);
  local_58 = copy_field_list(target_field_list);
  p_Var2 = src_ioformat->body;
  local_88 = p_Var2->field_list;
  p_Var3 = p_Var2->var_list;
  local_7c = p_Var2->float_format;
  conv = (IOConversionPtr)ffs_malloc((long)(int)uVar8 * 0x48 + 0xd8);
  p_Var1 = local_58;
  p_Var2 = src_ioformat->body;
  local_d4 = target_fp_format;
  if (target_fp_format == Format_Unknown) {
    local_d4 = ffs_my_float_format;
  }
  local_ac = p_Var2->column_major_arrays;
  conv->notify_of_format_change = 0;
  conv->context = src_ioformat->context;
  conv->ioformat = src_ioformat;
  conv->base_size_delta = (long)target_struct_size - (long)p_Var2->record_length;
  conv->max_var_expansion = 1.0;
  conv->conv_count = 0;
  qsort(local_58,(long)(int)uVar8,0x18,field_offset_compar);
  conv->native_field_list = p_Var1;
  conv->target_pointer_size = local_80;
  conv->required_alignment = 8;
  conv->free_data = (void *)0x0;
  conv->free_func = (_func_void_void_ptr *)0x0;
  conv->conv_pkg = (char *)0x0;
  conv->conv_func = (conv_routine)0x0;
  conv->conv_func4 = (conv_routine)0x0;
  conv->conv_func2 = (conv_routine)0x0;
  conv->conv_func1 = (conv_routine)0x0;
  conv->string_offset_size = local_60;
  conv->converted_strings = 0;
  uVar27 = (ulong)initial_conversion;
  uVar31 = 2;
  if (buffer_and_convert < initial_conversion) {
    uVar31 = (ulong)initial_conversion;
  }
  if (src_ioformat->body->record_length <= target_struct_size) {
    uVar31 = (ulong)initial_conversion;
  }
  local_a0 = conv->conversions;
  local_40 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    local_40 = 0;
  }
  local_48 = local_88 + 1;
  uVar22 = 0;
LAB_0010ec35:
  if (0 < (int)uVar22) {
    for (lVar33 = 0; (uVar22 & 0xffffffff) * 0x48 - lVar33 != 0; lVar33 = lVar33 + 0x48) {
      *(undefined8 *)((long)&conv->conversions[0].iovar + lVar33) = 0;
      free(*(void **)((long)&conv->conversions[0].default_value + lVar33));
      p_Var20 = *(IOConversionPtr *)((long)&conv->conversions[0].subconversion + lVar33);
      uVar27 = extraout_RDX;
      if (p_Var20 != (IOConversionPtr)0x0) {
        FFSfree_conversion(p_Var20);
        uVar27 = extraout_RDX_00;
      }
    }
  }
  conv->conversion_type = (IOconversion_type)uVar31;
  uVar28 = 0;
  local_50 = local_48;
  uVar22 = 0;
LAB_0010ec8e:
  iVar12 = (int)uVar27;
  if (uVar28 == local_40) goto LAB_0010f3de;
  default_val = (void *)0x0;
  p_Var1 = local_58 + uVar28;
  pcVar16 = local_58[uVar28].field_name;
  pcVar13 = strchr(pcVar16,0x28);
  local_98 = uVar22;
  local_90 = uVar31;
  if ((pcVar13 == (char *)0x0) || (conv->context->fmc->ignore_default_values != 0)) {
    uVar24 = extraout_RDX_01;
    pcVar13 = (char *)0x0;
  }
  else {
    sVar15 = strlen(pcVar16);
    pcVar16 = (char *)ffs_malloc(sVar15);
    pcVar13 = base_data_type(p_Var1->field_type);
    FVar10 = FMstr_to_data_type(pcVar13);
    strncpy(pcVar16,p_Var1->field_name,0x80);
    pcVar18 = strchr(pcVar16,0x28);
    default_val = (void *)0x0;
    free(pcVar13);
    uVar24 = extraout_RDX_05;
    pcVar13 = pcVar16;
    if (pcVar18 != (char *)0x0) {
      *pcVar18 = '\0';
      pcVar18 = pcVar18 + 1;
      pcVar19 = strchr(pcVar18,0x29);
      if (pcVar19 != (char *)0x0) {
        *pcVar19 = '\0';
      }
      uVar24 = extraout_RDX_06;
      if (0 < (int)pcVar19 - (int)pcVar18) {
        str_to_val(pcVar18,FVar10,p_Var1->field_size,&default_val);
        uVar24 = extraout_RDX_07;
      }
    }
  }
  if (uVar28 < 0xb) {
LAB_0010ed5b:
    uVar27 = 0xffffffffffffffff;
    p_Var26 = local_88;
    do {
      iVar12 = (int)uVar24;
      if (p_Var26->field_name == (char *)0x0) goto LAB_0010f39c;
      iVar9 = strcmp(pcVar16,p_Var26->field_name);
      iVar12 = (int)extraout_RDX_04;
      uVar27 = uVar27 + 1;
      p_Var26 = p_Var26 + 1;
      uVar24 = extraout_RDX_04;
    } while (iVar9 != 0);
  }
  else {
    uVar31 = (ulong)(int)uVar28;
    do {
      if ((long)uVar31 <= (long)(uVar28 - 10)) {
        p_Var26 = local_50;
        uVar27 = uVar28;
        goto LAB_0010ed38;
      }
      uVar27 = uVar31 & 0xffffffff;
      iVar9 = strcmp(pcVar16,local_88[uVar27].field_name);
      iVar12 = (int)extraout_RDX_02;
      uVar31 = uVar31 - 1;
      uVar24 = extraout_RDX_02;
    } while (iVar9 != 0);
  }
  goto LAB_0010ed84;
  while( true ) {
    iVar9 = strcmp(pcVar16,p_Var26->field_name);
    iVar12 = (int)extraout_RDX_03;
    p_Var26 = p_Var26 + 1;
    uVar27 = uVar27 + 1;
    uVar24 = extraout_RDX_03;
    if (iVar9 == 0) break;
LAB_0010ed38:
    if ((uVar28 + 9 <= uVar27) || (p_Var26->field_name == (char *)0x0)) goto LAB_0010ed5b;
  }
LAB_0010ed84:
  if ((int)uVar27 == -1) {
LAB_0010f39c:
    if (default_val == (void *)0x0) {
      fprintf(_stderr,"Requested field %s missing from input format\n",p_Var1->field_name);
      FFSfree_conversion(conv);
      free(pcVar13);
      return (IOConversionPtr)0x0;
    }
    if (((uint)local_90 & 0xfffffffe) == 2) {
LAB_0010f3de:
      p_Var21 = generate_conversion(conv,src_ioformat->body->alignment,iVar12);
      conv->conv_func = p_Var21;
      uVar8 = conv->required_alignment;
      switch((ulong)uVar8) {
      case 0:
      case 8:
        break;
      case 1:
        conv->conv_func1 = p_Var21;
      case 2:
        conv->conv_func2 = p_Var21;
      case 4:
        conv->conv_func4 = p_Var21;
        break;
      default:
        if ((uVar8 - 0x10 < 0x31) && ((0x1000000010001U >> ((ulong)(uVar8 - 0x10) & 0x3f) & 1) != 0)
           ) {
          return conv;
        }
      case 3:
      case 5:
      case 6:
      case 7:
        fprintf(_stderr,"Funky alignment, %d, for conversion %s\n",(ulong)uVar8,
                conv->ioformat->body->format_name);
      }
      return conv;
    }
    free(default_val);
    default_val = (void *)0x0;
    free(pcVar13);
    uVar27 = extraout_RDX_10;
LAB_0010f3ca:
    uVar8 = 2;
    goto LAB_0010f3cd;
  }
  free(pcVar13);
  if (default_val != (void *)0x0) {
    free(default_val);
    default_val = (void *)0x0;
  }
  uVar14 = (ulong)(int)uVar27;
  local_78 = (IOConversionPtr *)local_88[uVar14].field_name;
  local_70 = (FFSTypeHandle_conflict)local_88[uVar14].field_type;
  uVar8 = local_88[uVar14].field_size;
  local_38 = (size_t)local_88[uVar14].field_offset;
  local_a8 = uVar14;
  FVar10 = FMarray_str_to_data_type((char *)local_70,&in_elements);
  p_Var4 = local_70;
  lVar33 = in_elements;
  bVar34 = false;
  if (in_elements != 1) {
    sVar15 = strlen((char *)local_70);
    pcVar16 = (char *)memchr(p_Var4,0x5b,sVar15);
    if (pcVar16 == (char *)0x0) {
      bVar34 = false;
    }
    else {
      sVar15 = strlen(pcVar16);
      pvVar17 = memchr(pcVar16 + 1,0x5b,sVar15);
      bVar34 = pvVar17 != (void *)0x0;
    }
    if (lVar33 == -1) {
      in_elements = 1;
    }
  }
  FVar11 = FMarray_str_to_data_type(p_Var1->field_type,&target_elements);
  uVar31 = local_90;
  if (target_elements == -1) {
    target_elements = 1;
  }
  uVar29 = (uint)local_90;
  if (uVar29 < 2) {
    uVar27 = (ulong)(uint)p_Var1->field_offset;
    if (p_Var1->field_offset != local_88[uVar14].field_offset) goto LAB_0010f3ca;
    if (in_elements == target_elements) {
      if ((((local_b0 == 0) && (FVar10 != unknown_type)) && (FVar10 == FVar11)) &&
         (FVar10 != float_type || local_d4 == local_7c)) {
        bVar35 = local_ac != 0;
        iVar12 = field_is_flat(src_ioformat->body,&p_Var3[local_a8].type_desc);
        uVar27 = extraout_RDX_08;
        if (((iVar12 != 0) && (!(bool)(bVar35 & bVar34))) &&
           (uVar22 = local_98, p_Var1->field_size == uVar8)) goto LAB_0010f30e;
      }
    }
    if ((in_elements != 1) && (p_Var1->field_size != uVar8)) goto LAB_0010f3ca;
    if ((local_ac != 0) && (bVar34)) goto LAB_0010f3da;
    if (((FVar10 == unknown_type) &&
        (((p_Var3[local_a8].var_array == 0 && (p_Var3[local_a8].type_desc.type != FMType_pointer))
         && (src_ioformat->field_subformats[local_a8] != (FFSTypeHandle_conflict)0x0)))) &&
       (p_Var5 = src_ioformat->field_subformats[local_a8]->conversion,
       p_Var5 != (IOConversionPtr_conflict)0x0)) {
      IVar30 = p_Var5->conversion_type;
      uVar22 = local_98;
      if (IVar30 == none_required) goto LAB_0010f30e;
      if (IVar30 == direct_to_mem) {
        uVar31 = 1;
      }
      else if (IVar30 == buffer_and_convert) {
        uVar8 = 2;
        goto LAB_0010f3cd;
      }
    }
LAB_0010f069:
    iVar12 = p_Var3[local_a8].var_array;
    if ((iVar12 == 0) && (p_Var3[local_a8].type_desc.type != FMType_pointer)) {
LAB_0010f09b:
      if (p_Var3[local_a8].type_desc.type != FMType_pointer) goto LAB_0010f0e9;
    }
    else {
      uVar27 = (ulong)uVar8;
      if (p_Var1->field_size != uVar8) goto LAB_0010f3da;
LAB_0010f08a:
      if (iVar12 == 0) goto LAB_0010f09b;
    }
    uVar29 = p_Var1->field_size - 1;
    iVar12 = 8;
    if (uVar29 < 7) {
      iVar12 = *(int *)(&DAT_00135308 + (ulong)uVar29 * 4);
    }
    dVar36 = (double)(iVar12 + p_Var1->field_size) / (double)(int)uVar8;
    if (conv->max_var_expansion <= dVar36 && dVar36 != conv->max_var_expansion) {
      conv->max_var_expansion = dVar36;
    }
  }
  else {
    if (uVar29 == 2) goto LAB_0010f069;
    if (uVar29 == 3) {
      iVar12 = p_Var3[local_a8].var_array;
      uVar31 = 3;
      goto LAB_0010f08a;
    }
  }
LAB_0010f0e9:
  if ((in_elements != target_elements) || (FVar10 != FVar11)) {
    pp_Var25 = (IOConversionPtr *)p_Var1->field_name;
    pcVar16 = p_Var1->field_type;
    pcVar13 = "Requested field %s base type %s \n   differs from source type %s\n\n";
    src_ioformat = local_70;
LAB_0010f4fe:
    fprintf(_stderr,pcVar13,pp_Var25,pcVar16,src_ioformat);
    FFSfree_conversion(conv);
    return (IOConversionPtr)0x0;
  }
  IVar30 = (int)uVar31 + (uint)((int)uVar31 == 0);
  local_90 = (ulong)IVar30;
  conv->conversion_type = IVar30;
  lVar33 = (long)(int)local_98;
  local_a0[lVar33].subconversion = (IOConversionPtr)0x0;
  local_a0[lVar33].rc_swap = no_row_column_swap;
  pIVar6 = local_a0 + lVar33;
  (pIVar6->src_field).byte_swap = '\0';
  (pIVar6->src_field).src_float_format = '\0';
  (pIVar6->src_field).target_float_format = '\0';
  *(undefined5 *)&(pIVar6->src_field).field_0x13 = 0;
  *(undefined8 *)(&(pIVar6->src_field).byte_swap + 8) = 0;
  pIVar6 = local_a0 + lVar33;
  (pIVar6->src_field).offset = 0;
  (pIVar6->src_field).size = 0;
  (pIVar6->src_field).data_type = unknown_type;
  local_a0[lVar33].src_field.byte_swap = (uchar)local_b0;
  local_a0[lVar33].src_field.src_float_format = (uchar)local_7c;
  local_a0[lVar33].src_field.target_float_format = (uchar)local_d4;
  if ((local_ac != 0) && (bVar34)) {
    local_a0[lVar33].rc_swap =
         (src_ioformat->body->column_major_arrays == 0) + swap_source_column_major;
  }
  pIVar6 = local_a0 + lVar33;
  FVar10 = FMarray_str_to_data_type((char *)local_70,&in_elements);
  pFVar32 = p_Var3 + local_a8;
  pIVar6->iovar = pFVar32;
  if (FVar10 == unknown_type) {
    p_Var4 = src_ioformat->field_subformats[local_a8];
    if (p_Var4 == (FFSTypeHandle_conflict)0x0) {
      pcVar16 = src_ioformat->body->field_list[uVar14].field_type;
      pcVar13 = "Unknown field type for field %s ->\"%s\", format %p\n";
      pp_Var25 = local_78;
      goto LAB_0010f4fe;
    }
    local_a8 = local_a8 & 0xffffffff00000000;
    local_78 = &local_a0[lVar33].subconversion;
    pcVar16 = base_data_type((char *)local_70);
    plVar7 = (long *)CONCAT44(in_stack_0000001c,string_offset_size);
    do {
      plVar23 = plVar7;
      if ((char *)*plVar23 == (char *)0x0) break;
      iVar12 = strcmp(pcVar16,(char *)*plVar23);
      plVar7 = plVar23 + 4;
    } while (iVar12 != 0);
    iVar12 = 0x10f22a;
    free(pcVar16);
    p_Var20 = conv;
    if (p_Var4 != src_ioformat) {
      FVar10 = (FMdata_type)local_a8;
      if (*plVar23 == 0) goto LAB_0010f2a8;
      p_Var20 = create_conversion(p_Var4,(FMFieldList)plVar23[1],(int)plVar23[2],local_80,local_b0,
                                  local_d4,(IOconversion_type)local_90,(int)local_60,
                                  string_offset_size,iVar12,in_stack_ffffffffffffff08);
      if (*local_78 != (IOConversionPtr)0x0) {
        puts("Subconversion already had value!");
      }
    }
    *local_78 = p_Var20;
    FVar10 = (FMdata_type)local_a8;
  }
LAB_0010f2a8:
  if (pFVar32->var_array != 0) {
    in_elements = 1;
  }
  local_a0[lVar33].src_field.data_type = FVar10;
  local_a0[lVar33].src_field.offset = local_38;
  local_a0[lVar33].src_field.size = uVar8;
  local_a0[lVar33].dest_size = p_Var1->field_size;
  local_a0[lVar33].dest_offset = (long)p_Var1->field_offset;
  local_a0[lVar33].default_value = (void *)0x0;
  uVar8 = (int)local_98 + 1;
  conv->conv_count = uVar8;
  free(default_val);
  uVar27 = extraout_RDX_09;
  uVar31 = local_90;
  uVar22 = (ulong)uVar8;
LAB_0010f30e:
  uVar28 = uVar28 + 1;
  local_50 = local_50 + 1;
  goto LAB_0010ec8e;
LAB_0010f3da:
  uVar8 = 3;
LAB_0010f3cd:
  uVar31 = (ulong)uVar8;
  uVar22 = local_98;
  goto LAB_0010ec35;
}

Assistant:

static
IOConversionPtr
create_conversion(FFSTypeHandle src_ioformat, FMFieldList target_field_list, int target_struct_size, int pointer_size,
		  int byte_reversal, FMfloat_format target_fp_format, IOconversion_type initial_conversion,
		  int target_column_major, int string_offset_size, int converted_strings, FMStructDescList target_list)
{
    int target_field_count = count_FMfield(target_field_list);
    FMFieldList nfl_sort = copy_field_list(target_field_list);
    FMFieldList input_field_list = src_ioformat->body->field_list;
    FMVarInfoList input_var_list = src_ioformat->body->var_list;
    IOconversion_type conv = initial_conversion;
    int input_index, conv_index = 0, i = 0;
    FMfloat_format src_float_format = src_ioformat->body->float_format;
    IOConversionPtr conv_ptr =
	(IOConversionPtr) malloc(sizeof(IOConversionStruct) +
				 target_field_count * sizeof(IOconvFieldStruct));
    int column_row_swap_necessary = (target_column_major != src_ioformat->body->column_major_arrays);
    
    if (target_fp_format == Format_Unknown) target_fp_format = ffs_my_float_format;

    conv_ptr->notify_of_format_change = 0;
    conv_ptr->context = src_ioformat->context;
    conv_ptr->ioformat = src_ioformat;
    conv_ptr->base_size_delta = target_struct_size -
	src_ioformat->body->record_length;
    conv_ptr->max_var_expansion = 1.0;
    conv_ptr->conv_count = 0;
    qsort(nfl_sort, target_field_count, sizeof(nfl_sort[0]),
	  field_offset_compar);
    conv_ptr->native_field_list = nfl_sort;
    conv_ptr->target_pointer_size = pointer_size;
    conv_ptr->required_alignment = 8; /* placeholder */
    conv_ptr->free_data = NULL;
    conv_ptr->free_func = NULL;
    conv_ptr->conv_func = NULL;
    conv_ptr->conv_func4 = NULL;
    conv_ptr->conv_func2 = NULL;
    conv_ptr->conv_func1 = NULL;
    conv_ptr->conv_pkg = NULL;
    conv_ptr->string_offset_size = string_offset_size;
    conv_ptr->converted_strings = converted_strings;

    /* 
     * We assume that the fields listed in the target_field_list are
     * those that the user is interested in.  Skipping input fields
     * is OK... 
     */

    if (src_ioformat->body->record_length > target_struct_size) {
	/* if input record is larger than target record, must do buffered */
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    conv = buffer_and_convert;
	    break;
	case buffer_and_convert:
	case copy_dynamic_portion:
	    break;
	default:
	    assert(FALSE);
	}
    }
    /* try for no conversion/direct_to_memory first.. */
  restart:
    if (conv_index > 0) {
	/* really a restart, NULL a couple of things */
	int i = 0;
	for (i=0; i < conv_index; i++) {
	    conv_ptr->conversions[i].iovar = NULL;
	    if (conv_ptr->conversions[i].default_value) {
		free(conv_ptr->conversions[i].default_value);
	    }
	    if (conv_ptr->conversions[i].subconversion) {
		FFSfree_conversion(conv_ptr->conversions[i].subconversion);
	    }
	}
    }
    conv_ptr->conversion_type = conv;
    input_index = conv_index = 0;
    for (i = 0; i < target_field_count; i++) {
	FMField input_field;
	FMdata_type in_data_type, target_data_type;
	long in_elements, target_elements;
	void *default_val = NULL;
	char *tmp_field_name = NULL;
	char *search_name;
	int multi_dimen_array = 0;

	/* 
	 * all fields in the target list must appear at the same offset
	 * as in the input list.
	 */
	input_index = 0;
	
	if ((strchr(nfl_sort[i].field_name, '(') == NULL) || conv_ptr->context->fmc->ignore_default_values) {
	    /* no default value */
	    search_name = (char *) nfl_sort[i].field_name;
	} else {
	    tmp_field_name = malloc(strlen(nfl_sort[i].field_name)); /* certainly big enough */
	    field_name_strip_get_default(&nfl_sort[i], tmp_field_name, &default_val);
	    search_name = tmp_field_name;
	}
	input_index = find_field_for_conv(search_name, input_field_list, i, NULL);
	if (input_index == -1) {
	    if(default_val){
	        if ((conv == buffer_and_convert) || 
		    (conv == copy_dynamic_portion)) {
		    input_index = -1; /* Basically invalidating input_index
				   Indication for using default_val */
		    break;
		} else {
		    if (default_val) {
		        free(default_val);
			default_val = NULL;
		    }
		    conv = buffer_and_convert;
		    if (tmp_field_name) free(tmp_field_name);
		    goto restart;
		}
	    }
	    fprintf(stderr,
		    "Requested field %s missing from input format\n",
		    nfl_sort[i].field_name);
	    FFSfree_conversion(conv_ptr);
	    if (tmp_field_name) free(tmp_field_name);
	    return NULL;
	}
	if (tmp_field_name) free(tmp_field_name);
	if(input_index == -1){
	    create_default_conversion(nfl_sort[i], default_val, &conv_ptr, 
				      conv_index);
	    conv_ptr->conversion_type = conv;
	    conv_ptr->conv_count = ++conv_index;
	    continue;
	} else {
	    if (default_val) {
		free(default_val);
		default_val = NULL;
	    }
	}
	input_field = input_field_list[input_index];
	in_data_type = FMarray_str_to_data_type(input_field.field_type,
					      &in_elements);
	if (in_elements != 1) {
	    char *first_bracket = memchr(input_field.field_type, '[', strlen(input_field.field_type));
	    if (first_bracket != NULL) {
		char *sec_bracket = memchr(first_bracket+1, '[', strlen(first_bracket));
		if (sec_bracket) multi_dimen_array++;
	    }
	}
	    
	if (in_elements == -1) {
	    in_elements = 1;	/* var array */
	}
	target_data_type = FMarray_str_to_data_type(nfl_sort[i].field_type,
						  &target_elements);
	if (target_elements == -1) {
	    target_elements = 1;	/* var array */
	}
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    if (nfl_sort[i].field_offset !=
		input_field_list[input_index].field_offset) {

		/* 
		 * we were planning direct to memory transfer, but found a 
		 * field that we couldn't do that way.   start over
		 * planning buffer and convert. 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if ((in_elements == target_elements) &&
		(in_data_type == target_data_type) &&
		(in_data_type != unknown_type) &&
		(!byte_reversal) &&
		((in_data_type != float_type) ||
		 (target_fp_format == src_float_format)) &&
		field_is_flat(src_ioformat->body, 
			      &input_var_list[input_index].type_desc) &&
		(!column_row_swap_necessary || !multi_dimen_array) &&
		(nfl_sort[i].field_size == input_field.field_size)) {
		/* nothing to do for this field */
		continue;
	    }
	    if ((in_elements != 1) &&
		(nfl_sort[i].field_size != input_field.field_size)) {
		/* Can't do direct to memory with array field interleaving 
		 * 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if (column_row_swap_necessary && multi_dimen_array) {
		/* Can't transpose an array in place
		 * 
		 */
		conv = copy_dynamic_portion;
		goto restart;
	    }

	    if ((in_data_type == unknown_type) && 
		!input_var_list[input_index].var_array &&
		(input_var_list[input_index].type_desc.type != FMType_pointer)) {
		FFSTypeHandle format = src_ioformat->field_subformats[input_index];
		if ((format != NULL) && (format->conversion != NULL)) {
		    switch (format->conversion->conversion_type) {
		    case copy_dynamic_portion:
			assert(conv == copy_dynamic_portion);
			break;
		    case buffer_and_convert:
			conv = buffer_and_convert;
			goto restart;
		    case direct_to_mem:
			conv = direct_to_mem;
			break;
		    case none_required:
			continue;
		    }
		}
	    }
	    /* falling through */
	case buffer_and_convert:
	    if (input_var_list[input_index].var_array ||
	    	(input_var_list[input_index].type_desc.type == FMType_pointer)) {
	    	if (nfl_sort[i].field_size != input_field.field_size) {
	    	    /* argh.  Must buffer variant part too */
	    	    conv = copy_dynamic_portion;
	    	    goto restart;
	    	}
	    }
	case copy_dynamic_portion:
	    if (input_var_list[input_index].var_array ||
		(input_var_list[input_index].type_desc.type == FMType_pointer)) {
		/* 
		 * expansion value includes padding for possibly having
		 * to re-align the value to the proper boundary.
		 * (This is generally a gross overestimate, but it's safe.)
		 */
		int local_size = nfl_sort[i].field_size +
		min_align_size(nfl_sort[i].field_size);
		double expansion = ((double) local_size) / input_field.field_size;
		if (expansion > conv_ptr->max_var_expansion) {
		    conv_ptr->max_var_expansion = expansion;
		}
	    }
	    break;
	default:
	    assert(FALSE);
	}
	if ((in_elements != target_elements) || 
	    (in_data_type != target_data_type)) {

	    fprintf(stderr,
		    "Requested field %s base type %s \n   differs from source type %s\n\n",
		    nfl_sort[i].field_name, nfl_sort[i].field_type,
		    input_field.field_type);
	    FFSfree_conversion(conv_ptr);
	    return NULL;
	}
	if (conv == none_required) {
	    conv = direct_to_mem;
	}
	conv_ptr->conversion_type = conv;
	memset(&conv_ptr->conversions[conv_index].src_field, 0, 
	       sizeof(conv_ptr->conversions[conv_index].src_field));
	conv_ptr->conversions[conv_index].src_field.byte_swap = byte_reversal;
	conv_ptr->conversions[conv_index].src_field.src_float_format =
	    src_float_format;
	conv_ptr->conversions[conv_index].src_field.target_float_format =
	    target_fp_format;
	conv_ptr->conversions[conv_index].subconversion = NULL;
	conv_ptr->conversions[conv_index].iovar = NULL;
	conv_ptr->conversions[conv_index].rc_swap = no_row_column_swap;
	if (column_row_swap_necessary & multi_dimen_array) {
	    if (src_ioformat->body->column_major_arrays) {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_column_major;
	    } else {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_row_major;
	    }
	}
	in_data_type = FMarray_str_to_data_type(input_field.field_type, 
					      &in_elements);
	conv_ptr->conversions[conv_index].iovar =
	    &input_var_list[input_index];
	if (in_data_type == unknown_type) {
	    FFSTypeHandle format = src_ioformat->field_subformats[input_index];
	    if (format != NULL) {
		int format_index = 0;
		char *base_type = base_data_type(input_field.field_type);

		while(target_list[format_index].format_name && 
		      (strcmp(base_type, target_list[format_index].format_name) != 0)) {
		    format_index++;
		}
		free(base_type);
	        if (format == src_ioformat) {
		    conv_ptr->conversions[conv_index].subconversion = conv_ptr;
		} else if (target_list[format_index].format_name != NULL) {
		    IOConversionPtr subconv;
		    int target_struct_size = target_list[format_index].struct_size;
		    subconv =
		      create_conversion(format,
					target_list[format_index].field_list,
					target_struct_size, pointer_size,
					byte_reversal, target_fp_format,
					conv, target_column_major,
					string_offset_size,
					converted_strings, target_list);
		    if (conv_ptr->conversions[conv_index].subconversion) {
			printf("Subconversion already had value!\n");
		    }
		    conv_ptr->conversions[conv_index].subconversion = subconv;
		}
	    } else {
		
		fprintf(stderr, "Unknown field type for field %s ->\"%s\", format %p\n",
			input_field.field_name,
			src_ioformat->body->field_list[input_index].field_type,
			src_ioformat);
		FFSfree_conversion(conv_ptr);
		return NULL;
	    }
	}
	if (input_var_list[input_index].var_array) {
	    in_elements = 1;
	}
	conv_ptr->conversions[conv_index].src_field.data_type = in_data_type;
	conv_ptr->conversions[conv_index].src_field.offset =
	    input_field.field_offset;
	conv_ptr->conversions[conv_index].src_field.size =
	    input_field.field_size;
	conv_ptr->conversions[conv_index].dest_size =
	    nfl_sort[i].field_size;
	conv_ptr->conversions[conv_index].dest_offset =
	    nfl_sort[i].field_offset;
	conv_ptr->conversions[conv_index].default_value = NULL;
	conv_ptr->conv_count = ++conv_index;
	if (default_val) {
	    free(default_val);
	    default_val = NULL;
	}
    }
    conv_ptr->conv_func = generate_conversion(conv_ptr, src_ioformat->body->alignment, 4);
    switch(conv_ptr->required_alignment) {
    case 1:
	conv_ptr->conv_func1 = conv_ptr->conv_func;
	/* falling */
    case 2:
	conv_ptr->conv_func2 = conv_ptr->conv_func;
	/* falling */
    case 4:
	conv_ptr->conv_func4 = conv_ptr->conv_func;
	/* falling */
    case 8:
    case 16:
    case 32:
    case 64:
	/* really can't imagine these currently, but... */
    case 0:
	/* zero is no conversion, so no requirement */
	break;
    default:
	fprintf(stderr, "Funky alignment, %d, for conversion %s\n",
		conv_ptr->required_alignment, 
		conv_ptr->ioformat->body->format_name);
    }
    return conv_ptr;
}